

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptset.cpp
# Opt level: O0

void __thiscall
icu_63::ScriptSet::setScriptExtensions(ScriptSet *this,UChar32 codePoint,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UScriptCode *pUVar3;
  int local_64;
  int32_t i;
  UErrorCode local_4c;
  int32_t script_count;
  UErrorCode internalStatus;
  MaybeStackArray<UScriptCode,_5> scripts;
  UErrorCode *status_local;
  UChar32 codePoint_local;
  ScriptSet *this_local;
  
  scripts._32_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    MaybeStackArray<UScriptCode,_5>::MaybeStackArray
              ((MaybeStackArray<UScriptCode,_5> *)&script_count);
    do {
      local_4c = U_ZERO_ERROR;
      pUVar3 = MaybeStackArray<UScriptCode,_5>::getAlias
                         ((MaybeStackArray<UScriptCode,_5> *)&script_count);
      iVar2 = MaybeStackArray<UScriptCode,_5>::getCapacity
                        ((MaybeStackArray<UScriptCode,_5> *)&script_count);
      iVar2 = uscript_getScriptExtensions_63(codePoint,pUVar3,iVar2,&local_4c);
      if (local_4c != U_BUFFER_OVERFLOW_ERROR) {
        UVar1 = ::U_FAILURE(local_4c);
        if (UVar1 != '\0') {
          *(UErrorCode *)scripts._32_8_ = local_4c;
          goto LAB_001686c9;
        }
        local_64 = 0;
        goto LAB_00168659;
      }
      pUVar3 = MaybeStackArray<UScriptCode,_5>::resize
                         ((MaybeStackArray<UScriptCode,_5> *)&script_count,iVar2,0);
    } while (pUVar3 != (UScriptCode *)0x0);
    *(undefined4 *)scripts._32_8_ = 7;
LAB_001686c9:
    MaybeStackArray<UScriptCode,_5>::~MaybeStackArray
              ((MaybeStackArray<UScriptCode,_5> *)&script_count);
  }
  return;
LAB_00168659:
  if (iVar2 <= local_64) goto LAB_001686c9;
  pUVar3 = MaybeStackArray<UScriptCode,_5>::operator[]
                     ((MaybeStackArray<UScriptCode,_5> *)&script_count,(long)local_64);
  set(this,*pUVar3,(UErrorCode *)scripts._32_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)scripts._32_8_);
  if (UVar1 != '\0') goto LAB_001686c9;
  local_64 = local_64 + 1;
  goto LAB_00168659;
}

Assistant:

void ScriptSet::setScriptExtensions(UChar32 codePoint, UErrorCode& status) {
    if (U_FAILURE(status)) { return; }
    static const int32_t FIRST_GUESS_SCRIPT_CAPACITY = 5;
    MaybeStackArray<UScriptCode,FIRST_GUESS_SCRIPT_CAPACITY> scripts;
    UErrorCode internalStatus = U_ZERO_ERROR;
    int32_t script_count = -1;

    while (TRUE) {
        script_count = uscript_getScriptExtensions(
            codePoint, scripts.getAlias(), scripts.getCapacity(), &internalStatus);
        if (internalStatus == U_BUFFER_OVERFLOW_ERROR) {
            // Need to allocate more space
            if (scripts.resize(script_count) == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            internalStatus = U_ZERO_ERROR;
        } else {
            break;
        }
    }

    // Check if we failed for some reason other than buffer overflow
    if (U_FAILURE(internalStatus)) {
        status = internalStatus;
        return;
    }

    // Load the scripts into the ScriptSet and return
    for (int32_t i = 0; i < script_count; i++) {
        this->set(scripts[i], status);
        if (U_FAILURE(status)) { return; }
    }
}